

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

void __thiscall
HttpResponse::HttpResponse(HttpResponse *this,string *responseData,URL *originalURL,Log *log)

{
  _Rb_tree_header *p_Var1;
  Log *this_00;
  bool bVar2;
  StringBufferHelper *this_01;
  string *this_02;
  allocator local_119;
  string *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->_httpStatusCode)._M_dataplus._M_p = (pointer)&(this->_httpStatusCode).field_2;
  (this->_httpStatusCode)._M_string_length = 0;
  (this->_httpStatusCode).field_2._M_local_buf[0] = '\0';
  (this->_httpStatusText)._M_dataplus._M_p = (pointer)&(this->_httpStatusText).field_2;
  (this->_httpStatusText)._M_string_length = 0;
  (this->_httpStatusText).field_2._M_local_buf[0] = '\0';
  (this->_httpVersion)._M_dataplus._M_p = (pointer)&(this->_httpVersion).field_2;
  (this->_httpVersion)._M_string_length = 0;
  (this->_httpVersion).field_2._M_local_buf[0] = '\0';
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118 = &this->_httpStatusCode;
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->_headerMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->_log;
  Log::Log(this_00);
  Log::operator=(this_00,log);
  this->_requestURL = originalURL;
  std::__cxx11::string::string((string *)&local_50,"HttpResponse",(allocator *)&local_110);
  std::__cxx11::string::string((string *)&local_70,"Starting parsing",&local_119);
  Log::Add(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::substr((ulong)&local_110,(ulong)responseData);
  bVar2 = std::operator==(&local_110,"ERROR");
  std::__cxx11::string::~string((string *)&local_110);
  if (bVar2) {
    std::__cxx11::string::assign((char *)local_118);
    std::__cxx11::string::substr((ulong)&local_110,(ulong)responseData);
    std::__cxx11::string::operator=((string *)&this->_httpStatusText,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string
              ((string *)&local_90,"Client handled error occured",(allocator *)&local_110);
    Log::Add(this_00,&local_90);
    this_02 = &local_90;
  }
  else {
    this_01 = (StringBufferHelper *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_b0,(string *)responseData);
    StringBufferHelper::StringBufferHelper(this_01,&local_b0);
    this->_pRawBuffer = this_01;
    std::__cxx11::string::~string((string *)&local_b0);
    parseHttpResponseData(this);
    std::__cxx11::string::string((string *)&local_d0,"HttpResponse",(allocator *)&local_110);
    std::__cxx11::string::string((string *)&local_f0,"Parsing of response went ok",&local_119);
    Log::Add(this_00,&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    this_02 = &local_d0;
  }
  std::__cxx11::string::~string((string *)this_02);
  return;
}

Assistant:

HttpResponse::HttpResponse(string responseData, URL* originalURL,
                            Log log) {
  _log = log;
  _requestURL = originalURL;
  _log.Add("HttpResponse", "Starting parsing");

  if (responseData.substr(0, 5) == "ERROR") {
    _httpStatusCode = "999";
    _httpStatusText = responseData.substr(5, responseData.size()-5);
    _log.Add("Client handled error occured");
  } else {
    _pRawBuffer = new StringBufferHelper(responseData);
    parseHttpResponseData();
    _log.Add("HttpResponse", "Parsing of response went ok");
  }
}